

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O0

service * std::experimental::net::v1::detail::service_registry::
          create<std::experimental::net::v1::detail::scheduler,std::experimental::net::v1::execution_context>
                    (void *owner)

{
  service *psVar1;
  int in_stack_00000014;
  execution_context *in_stack_00000018;
  
  psVar1 = (service *)operator_new(0xf0);
  webfront::http::std::experimental::net::v1::detail::scheduler::scheduler
            ((scheduler *)owner,in_stack_00000018,in_stack_00000014);
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}